

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pkcs8.cc
# Opt level: O0

int pkcs12_pbe_encrypt_init
              (CBB *out,EVP_CIPHER_CTX *ctx,int alg_nid,EVP_CIPHER *alg_cipher,uint32_t iterations,
              char *pass,size_t pass_len,uint8_t *salt,size_t salt_len)

{
  int iVar1;
  pbe_suite *suite_00;
  undefined1 local_a8 [8];
  CBB param;
  CBB algorithm;
  pbe_suite *suite;
  char *pass_local;
  uint32_t iterations_local;
  EVP_CIPHER *alg_cipher_local;
  int alg_nid_local;
  EVP_CIPHER_CTX *ctx_local;
  CBB *out_local;
  
  if (alg_nid == -1) {
    out_local._4_4_ =
         PKCS5_pbe2_encrypt_init(out,ctx,alg_cipher,iterations,pass,pass_len,salt,salt_len);
  }
  else {
    suite_00 = get_pkcs12_pbe_suite(alg_nid);
    if (suite_00 == (pbe_suite *)0x0) {
      ERR_put_error(0x13,0,0x77,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/pkcs8/pkcs8.cc"
                    ,300);
      out_local._4_4_ = 0;
    }
    else {
      iVar1 = CBB_add_asn1(out,(CBB *)((long)&param.u + 0x18),0x20000010);
      if ((((iVar1 != 0) &&
           (iVar1 = CBB_add_asn1_element
                              ((CBB *)((long)&param.u + 0x18),6,suite_00->oid,
                               (ulong)suite_00->oid_len), iVar1 != 0)) &&
          (iVar1 = CBB_add_asn1((CBB *)((long)&param.u + 0x18),(CBB *)local_a8,0x20000010),
          iVar1 != 0)) &&
         (((iVar1 = CBB_add_asn1_octet_string((CBB *)local_a8,salt,salt_len), iVar1 != 0 &&
           (iVar1 = CBB_add_asn1_uint64((CBB *)local_a8,(ulong)iterations), iVar1 != 0)) &&
          (iVar1 = CBB_flush(out), iVar1 != 0)))) {
        iVar1 = pkcs12_pbe_cipher_init(suite_00,ctx,iterations,pass,pass_len,salt,salt_len,1);
        return iVar1;
      }
      out_local._4_4_ = 0;
    }
  }
  return out_local._4_4_;
}

Assistant:

int pkcs12_pbe_encrypt_init(CBB *out, EVP_CIPHER_CTX *ctx, int alg_nid,
                            const EVP_CIPHER *alg_cipher, uint32_t iterations,
                            const char *pass, size_t pass_len,
                            const uint8_t *salt, size_t salt_len) {
  // TODO(davidben): OpenSSL has since extended |pbe_nid| to control either
  // the PBES1 scheme or the PBES2 PRF. E.g. passing |NID_hmacWithSHA256| will
  // select PBES2 with HMAC-SHA256 as the PRF. Implement this if anything uses
  // it. See 5693a30813a031d3921a016a870420e7eb93ec90 in OpenSSL.
  if (alg_nid == -1) {
    return PKCS5_pbe2_encrypt_init(out, ctx, alg_cipher, iterations, pass,
                                   pass_len, salt, salt_len);
  }

  const struct pbe_suite *suite = get_pkcs12_pbe_suite(alg_nid);
  if (suite == NULL) {
    OPENSSL_PUT_ERROR(PKCS8, PKCS8_R_UNKNOWN_ALGORITHM);
    return 0;
  }

  // See RFC 2898, appendix A.3.
  CBB algorithm, param;
  if (!CBB_add_asn1(out, &algorithm, CBS_ASN1_SEQUENCE) ||
      !CBB_add_asn1_element(&algorithm, CBS_ASN1_OBJECT, suite->oid,
                            suite->oid_len) ||
      !CBB_add_asn1(&algorithm, &param, CBS_ASN1_SEQUENCE) ||
      !CBB_add_asn1_octet_string(&param, salt, salt_len) ||
      !CBB_add_asn1_uint64(&param, iterations) || !CBB_flush(out)) {
    return 0;
  }

  return pkcs12_pbe_cipher_init(suite, ctx, iterations, pass, pass_len, salt,
                                salt_len, 1 /* encrypt */);
}